

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Int_t * Gia_AigerReadPacking(uchar **ppPos,int nSize)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *__ptr;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = nSize + 3;
  if (-1 < nSize) {
    iVar7 = nSize;
  }
  iVar7 = iVar7 >> 2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar8 = iVar7;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar8;
  if (iVar8 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar8 << 2);
  }
  pVVar2->pArray = __ptr;
  if ((nSize & 3U) != 0) {
    __assert_fail("nSize % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                  ,0x132,"Vec_Int_t *Gia_AigerReadPacking(unsigned char **, int)");
  }
  if (3 < nSize) {
    puVar4 = *ppPos;
    iVar8 = 0;
    do {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar6 = (uint)puVar4[lVar5] | uVar6 << 8;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 4);
      uVar1 = pVVar2->nSize;
      if (uVar1 == pVVar2->nCap) {
        if ((int)uVar1 < 0x10) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc(0x40);
          }
          else {
            __ptr = (int *)realloc(__ptr,0x40);
          }
          pVVar2->pArray = __ptr;
          iVar3 = 0x10;
          if (__ptr == (int *)0x0) {
LAB_001d5815:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        else {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc((ulong)uVar1 * 8);
          }
          else {
            __ptr = (int *)realloc(__ptr,(ulong)uVar1 * 8);
          }
          pVVar2->pArray = __ptr;
          if (__ptr == (int *)0x0) goto LAB_001d5815;
          iVar3 = uVar1 * 2;
        }
        pVVar2->nCap = iVar3;
      }
      pVVar2->nSize = uVar1 + 1;
      __ptr[(int)uVar1] = uVar6;
      iVar8 = iVar8 + 1;
      puVar4 = *ppPos + 4;
      *ppPos = puVar4;
    } while (iVar8 != iVar7);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_AigerReadPacking( unsigned char ** ppPos, int nSize )
{
    Vec_Int_t * vPacking = Vec_IntAlloc( nSize/4 );
    int i;
    assert( nSize % 4 == 0 );
    for ( i = 0; i < nSize/4; i++, *ppPos += 4 )
        Vec_IntPush( vPacking, Gia_AigerReadInt( *ppPos ) );
    return vPacking;
}